

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

void update_topbar(game_event_type type,game_event_data *data,void *user,wchar_t row)

{
  short sVar1;
  short sVar2;
  int iVar3;
  _Bool _Var4;
  uint8_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  _Bool short_mode;
  uint8_t *attr;
  wchar_t wVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  wchar_t wVar15;
  char max_hp [32];
  char tmp [32];
  char *local_260;
  uint8_t local_258 [32];
  char local_238 [520];
  
  prt("",type,L'\0');
  strnfmt(local_238,0x20,"%d",(ulong)(uint)(int)player->lev);
  sVar1 = player->lev;
  sVar2 = player->max_lev;
  pcVar12 = "L:";
  if (sVar1 < sVar2) {
    pcVar12 = "l:";
  }
  put_str(pcVar12,type,L'\0');
  c_put_str((sVar2 <= sVar1) * '\x02' + '\v',local_238,type,L'\x02');
  sVar8 = strlen(local_238);
  iVar14 = (int)sVar8;
  lVar10 = (long)player->exp;
  if ((long)player->lev == 0x32) {
    local_260 = "exp:";
    pcVar12 = "EXP:";
  }
  else {
    lVar10 = (int)((uint)player->expfact * *(int *)(&DAT_0026e63c + (long)player->lev * 4)) / 100 -
             lVar10;
    local_260 = "nxt:";
    pcVar12 = "NXT:";
  }
  strnfmt(local_238,0x20,"%ld",lVar10);
  iVar3 = player->exp;
  iVar13 = player->max_exp;
  if (iVar3 < iVar13) {
    pcVar12 = local_260;
  }
  put_str(pcVar12,type,iVar14 + L'\x03');
  c_put_str((iVar13 <= iVar3) * '\x02' + '\v',local_238,type,iVar14 + L'\a');
  sVar8 = strlen(local_238);
  wVar6 = prt_stat_short(L'\0',type,iVar14 + (int)sVar8 + L'\b');
  wVar11 = wVar6 + iVar14 + (int)sVar8 + L'\b';
  wVar6 = prt_stat_short(L'\x01',type,wVar11);
  wVar6 = wVar6 + wVar11;
  wVar11 = prt_stat_short(L'\x02',type,wVar6);
  wVar11 = wVar11 + wVar6;
  wVar7 = prt_stat_short(L'\x03',type,wVar11);
  wVar7 = wVar7 + wVar11;
  wVar11 = prt_stat_short(L'\x04',type,wVar7);
  wVar6 = wVar7 + wVar11;
  put_str("AC:",type,wVar6);
  strnfmt(local_238,0x20,"%d",(ulong)(uint)((player->known_state).to_a + (player->known_state).ac));
  c_put_str('\r',local_238,type,wVar11 + wVar7 + L'\x03');
  sVar8 = strlen(local_238);
  wVar11 = (int)sVar8 + wVar6 + L'\x04';
  put_str("AU:",type,wVar11);
  strnfmt(local_238,0x20,"%ld",(long)player->au);
  c_put_str('\r',local_238,type,(int)sVar8 + wVar6 + L'\a');
  sVar8 = strlen(local_238);
  memset(local_238,0,0x200);
  _Var4 = player_is_shapechanged(player);
  if (!_Var4) {
    strnfmt(local_238,0x200,"%s %s",player->race->name,player->class->title[(player->lev + -1) / 5])
    ;
    c_put_str('\r',local_238,type,(int)sVar8 + wVar11 + L'\x04');
  }
  wVar6 = type + L'\x01';
  prt("",wVar6,L'\0');
  uVar5 = player_hp_attr(player);
  put_str("HP:",wVar6,L'\0');
  strnfmt((char *)local_258,0x20,"%d",(ulong)(uint)(int)player->mhp);
  strnfmt(local_238,0x20,"%d",(ulong)(uint)(int)player->chp);
  c_put_str(uVar5,local_238,wVar6,L'\x03');
  sVar8 = strlen(local_238);
  c_put_str('\x01',"/",wVar6,(int)sVar8 + L'\x03');
  c_put_str('\r',(char *)local_258,wVar6,(int)sVar8 + L'\x04');
  sVar8 = strlen(local_238);
  sVar9 = strlen((char *)local_258);
  iVar14 = (int)sVar8 + (int)sVar9;
  wVar11 = iVar14 + L'\x05';
  uVar5 = player_sp_attr(player);
  if ((player->class->magic).total_spells == 0) {
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    if ((player->class->magic).spell_first <= (int)player->lev) {
      put_str("SP:",wVar6,wVar11);
      strnfmt((char *)local_258,0x20,"%d",(ulong)(uint)(int)player->msp);
      strnfmt(local_238,0x20,"%d",(ulong)(uint)(int)player->csp);
      c_put_str(uVar5,local_238,wVar6,iVar14 + L'\b');
      sVar8 = strlen(local_238);
      c_put_str('\x01',"/",wVar6,wVar11 + (int)sVar8 + L'\x03');
      c_put_str('\r',(char *)local_258,wVar6,wVar11 + (int)sVar8 + L'\x04');
      sVar8 = strlen(local_238);
      sVar9 = strlen((char *)local_258);
      iVar13 = (int)sVar8 + (int)sVar9 + 5;
    }
  }
  wVar7 = prt_health_aux(wVar6,iVar13 + wVar11);
  iVar14 = wVar7 + L'\x01';
  if (wVar7 == L'\0') {
    iVar14 = 0;
  }
  wVar15 = iVar14 + iVar13 + wVar11;
  wVar7 = (wchar_t)local_258;
  wVar11 = prt_speed_aux(local_238,wVar7,attr);
  if (wVar11 < L'\x01') {
    iVar14 = 0;
  }
  else {
    pcVar12 = local_238;
    c_put_str(local_258[0],pcVar12,wVar6,wVar15);
    wVar7 = (wchar_t)pcVar12;
    iVar14 = wVar11 + L'\x01';
  }
  wVar15 = iVar14 + wVar15;
  wVar11 = fmt_depth(local_238,wVar7);
  put_str(local_238,wVar6,wVar15);
  wVar7 = fmt_title(local_238,L'\x01',short_mode);
  if (L'\0' < wVar7) {
    c_put_str('\v',local_238,wVar6,wVar15 + wVar11 + L'\x01');
  }
  return;
}

Assistant:

static void update_topbar(game_event_type type, game_event_data *data,
						  void *user, int row)
{	
	int col = 0;	

	prt("", row, col);	

	col += prt_level_short(row, col);

	col += prt_exp_short(row, col);
	
	col += prt_stat_short(STAT_STR, row, col);
	col += prt_stat_short(STAT_INT, row, col);
	col += prt_stat_short(STAT_WIS, row, col);
	col += prt_stat_short(STAT_DEX, row, col);
	col += prt_stat_short(STAT_CON, row, col);

	col += prt_ac_short(row, col);

	col += prt_gold_short(row, col);

	col += prt_race_class_short(row, col);

	++row;
	col = 0;

	prt("", row, col);

	col += prt_hp_short(row, col);
	col += prt_sp_short(row, col);
	col += prt_health_short(row, col);	
	col += prt_speed_short(row, col);
	col += prt_depth_short(row, col);
	col += prt_title_short(row, col);
}